

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stdlib.hpp
# Opt level: O0

int iutest::detail::iu_mbtowc(wchar_t *dst,char *src,size_t size)

{
  int iVar1;
  size_t size_local;
  char *src_local;
  wchar_t *dst_local;
  
  iVar1 = mbtowc(dst,src,size);
  return iVar1;
}

Assistant:

inline int iu_mbtowc(wchar_t* dst, const char* src, size_t size)
{
#if defined(IUTEST_OS_LINUX_ANDROID) || defined(IUTEST_OS_WINDOWS_MOBILE)
    // unimplimented
    IUTEST_UNUSED_VAR(dst);
    IUTEST_UNUSED_VAR(src);
    IUTEST_UNUSED_VAR(size);
    return 0;
#else
    return mbtowc(dst, src, size);
#endif
}